

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O2

Sexp * __thiscall GcHeap::GcHeapImpl::Forward(GcHeapImpl *this,Sexp *ptr)

{
  mapped_type *ppSVar1;
  mapped_type pSVar2;
  Sexp *local_18;
  Sexp *ptr_local;
  
  local_18 = ptr;
  ppSVar1 = std::__detail::
            _Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->forwarding_addresses,&local_18);
  pSVar2 = *ppSVar1;
  if (pSVar2 == (mapped_type)0x0) {
    pSVar2 = Copy(this,local_18);
    if (pSVar2 == (Sexp *)0x0) {
      __assert_fail("to_ref != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                    ,0x149,"Sexp *GcHeap::GcHeapImpl::Forward(Sexp *)");
    }
  }
  return pSVar2;
}

Assistant:

Sexp *Forward(Sexp *ptr) {
    Sexp *to_ref = forwarding_addresses[ptr];
    if (to_ref == nullptr) {
      // this reference hasn't been copied yet. do it.
      to_ref = Copy(ptr);
    }

    // DebugLog("processed value: %s", to_ref->DumpString().c_str());
    assert(to_ref != nullptr);
    return to_ref;
  }